

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall helics::RerouteFilterOperation::RerouteFilterOperation(RerouteFilterOperation *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__RerouteFilterOperation_00552ea8;
  (this->op).super___shared_ptr<helics::MessageDestOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00553168;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:330:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:330:9)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  MessageDestOperator::MessageDestOperator
            ((MessageDestOperator *)(p_Var2 + 1),
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  (this->op).super___shared_ptr<helics::MessageDestOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  (this->op).super___shared_ptr<helics::MessageDestOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (MessageDestOperator *)(p_Var2 + 1);
  (this->newDest).m_obj._M_dataplus._M_p = (pointer)&(this->newDest).m_obj.field_2;
  (this->newDest).m_obj._M_string_length = 0;
  (this->newDest).m_obj.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header;
  (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->newDest).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->newDest).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->newDest).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->newDest).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->newDest).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)&(this->conditions).m_obj._M_t._M_impl = 0;
  *(undefined8 *)&(this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->conditions).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->conditions).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->conditions).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->conditions).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->conditions).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->conditions).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->conditions).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  return;
}

Assistant:

RerouteFilterOperation::RerouteFilterOperation():
    op(std::make_shared<MessageDestOperator>(
        [this](const std::string& src, const std::string& dest) {
            return rerouteOperation(src, dest);
        }))
{
}